

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

void BinaryenModuleSetFieldName
               (BinaryenModuleRef module,BinaryenHeapType heapType,BinaryenIndex index,char *name)

{
  unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
  *this;
  mapped_type *pmVar1;
  mapped_type *this_00;
  HeapType local_40;
  Name local_38;
  char *local_28;
  char *name_local;
  BinaryenHeapType BStack_18;
  BinaryenIndex index_local;
  BinaryenHeapType heapType_local;
  BinaryenModuleRef module_local;
  
  local_28 = name;
  name_local._4_4_ = index;
  BStack_18 = heapType;
  heapType_local = (BinaryenHeapType)module;
  wasm::Name::Name(&local_38,name);
  this = (unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
          *)(heapType_local + 0x120);
  wasm::HeapType::HeapType(&local_40,BStack_18);
  pmVar1 = std::
           unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
           ::operator[](this,&local_40);
  this_00 = std::
            unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
            ::operator[](&pmVar1->fieldNames,(key_type *)((long)&name_local + 4));
  wasm::Name::operator=(this_00,&local_38);
  return;
}

Assistant:

void BinaryenModuleSetFieldName(BinaryenModuleRef module,
                                BinaryenHeapType heapType,
                                BinaryenIndex index,
                                const char* name) {
  ((Module*)module)->typeNames[HeapType(heapType)].fieldNames[index] = name;
}